

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeAddOp4Int(Vdbe *p,int op,int p1,int p2,int p3,int p4)

{
  Op *pOVar1;
  VdbeOp *pOp;
  int i;
  int p4_local;
  int p3_local;
  int p2_local;
  int p1_local;
  int op_local;
  Vdbe *p_local;
  
  p_local._4_4_ = p->nOp;
  if (p_local._4_4_ < p->nOpAlloc) {
    p->nOp = p->nOp + 1;
    pOVar1 = p->aOp + p_local._4_4_;
    pOVar1->opcode = (u8)op;
    pOVar1->p5 = 0;
    pOVar1->p1 = p1;
    pOVar1->p2 = p2;
    pOVar1->p3 = p3;
    (pOVar1->p4).i = p4;
    pOVar1->p4type = -3;
  }
  else {
    p_local._4_4_ = addOp4IntSlow(p,op,p1,p2,p3,p4);
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOp4Int(
  Vdbe *p,            /* Add the opcode to this VM */
  int op,             /* The new opcode */
  int p1,             /* The P1 operand */
  int p2,             /* The P2 operand */
  int p3,             /* The P3 operand */
  int p4              /* The P4 operand as an integer */
){
  int i;
  VdbeOp *pOp;

  i = p->nOp;
  if( p->nOpAlloc<=i ){
    return addOp4IntSlow(p, op, p1, p2, p3, p4);
  }
  p->nOp++;
  pOp = &p->aOp[i];
  assert( pOp!=0 );
  pOp->opcode = (u8)op;
  pOp->p5 = 0;
  pOp->p1 = p1;
  pOp->p2 = p2;
  pOp->p3 = p3;
  pOp->p4.i = p4;
  pOp->p4type = P4_INT32;

  /* Replicate this logic in sqlite3VdbeAddOp3()
  ** vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv   */
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  pOp->zComment = 0;
#endif
#if defined(SQLITE_ENABLE_STMT_SCANSTATUS) || defined(VDBE_PROFILE)
  pOp->nExec = 0;
  pOp->nCycle = 0;
#endif
#ifdef SQLITE_DEBUG
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    sqlite3VdbePrintOp(0, i, &p->aOp[i]);
    test_addop_breakpoint(i, &p->aOp[i]);
  }
#endif
#ifdef SQLITE_VDBE_COVERAGE
  pOp->iSrcLine = 0;
#endif
  /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^
  ** Replicate in sqlite3VdbeAddOp3() */

  return i;
}